

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_ASCIIHexDecoder.cc
# Opt level: O3

ssize_t __thiscall
Pl_ASCIIHexDecoder::write(Pl_ASCIIHexDecoder *this,int __fd,void *__buf,size_t __n)

{
  size_t sVar1;
  int iVar2;
  long in_RAX;
  undefined4 extraout_var;
  ssize_t extraout_RAX;
  runtime_error *this_00;
  long *plVar3;
  int iVar4;
  long *plVar5;
  undefined4 in_register_00000034;
  long lVar6;
  bool bVar7;
  char t [2];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  if ((__buf != (void *)0x0) && (this->eod == false)) {
    lVar6 = 0;
    do {
      iVar2 = toupper((uint)*(byte *)(CONCAT44(in_register_00000034,__fd) + lVar6));
      in_RAX = CONCAT44(extraout_var,iVar2);
      iVar4 = (int)(char)iVar2;
      if ((4 < iVar4 - 9U) && (iVar4 != 0x20)) {
        if (iVar4 == 0x3e) {
          this->eod = true;
        }
        else {
          if (5 < iVar4 - 0x41U && 9 < iVar4 - 0x30U) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_68[0] = local_58;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_68,"character out of range during base Hex decode: ","");
            plVar3 = (long *)std::__cxx11::string::append((char *)local_68);
            local_48 = (long *)*plVar3;
            plVar5 = plVar3 + 2;
            if (local_48 == plVar5) {
              local_38 = *plVar5;
              lStack_30 = plVar3[3];
              local_48 = &local_38;
            }
            else {
              local_38 = *plVar5;
            }
            local_40 = plVar3[1];
            *plVar3 = (long)plVar5;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            std::runtime_error::runtime_error(this_00,(string *)&local_48);
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          sVar1 = this->pos;
          this->pos = sVar1 + 1;
          this->inbuf[sVar1] = (char)iVar2;
          if (this->pos != 2) goto LAB_00132135;
        }
        flush(this);
        in_RAX = extraout_RAX;
      }
LAB_00132135:
    } while ((this->eod == false) &&
            (in_RAX = lVar6 + 1, bVar7 = (long)__buf + -1 != lVar6, lVar6 = in_RAX, bVar7));
  }
  return in_RAX;
}

Assistant:

void
Pl_ASCIIHexDecoder::write(unsigned char const* buf, size_t len)
{
    if (this->eod) {
        return;
    }
    for (size_t i = 0; i < len; ++i) {
        char ch = static_cast<char>(toupper(buf[i]));
        switch (ch) {
        case ' ':
        case '\f':
        case '\v':
        case '\t':
        case '\r':
        case '\n':
            QTC::TC("libtests", "Pl_ASCIIHexDecoder ignore space");
            // ignore whitespace
            break;

        case '>':
            this->eod = true;
            flush();
            break;

        default:
            if (((ch >= '0') && (ch <= '9')) || ((ch >= 'A') && (ch <= 'F'))) {
                this->inbuf[this->pos++] = ch;
                if (this->pos == 2) {
                    flush();
                }
            } else {
                char t[2];
                t[0] = ch;
                t[1] = 0;
                throw std::runtime_error("character out of range during base Hex decode: "s + t);
            }
            break;
        }
        if (this->eod) {
            break;
        }
    }
}